

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.cpp
# Opt level: O3

void unodb::detail::dump_byte(ostream *os,byte byte)

{
  ostream *poVar1;
  long lVar2;
  ostream *poVar3;
  char local_21;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  lVar2 = *(long *)poVar1;
  *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = poVar1 + *(long *)(lVar2 + -0x18);
  if (poVar1[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
    lVar2 = *(long *)poVar1;
  }
  poVar3[0xe0] = (ostream)0x30;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump_byte(std::ostream &os,
                                                   std::byte byte) {
  os << ' ' << std::hex << std::setfill('0') << std::setw(2)
     << static_cast<unsigned>(byte) << std::dec;
}